

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyDfs.c
# Opt level: O3

Vec_Int_t * Ivy_ManDfs(Ivy_Man_t *p)

{
  byte *pbVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *vNodes;
  int *piVar4;
  Vec_Ptr_t *pVVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  Vec_Ptr_t *pVVar9;
  
  if (p->nObjs[4] != 0) {
    __assert_fail("Ivy_ManLatchNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyDfs.c"
                  ,0x5c,"Vec_Int_t *Ivy_ManDfs(Ivy_Man_t *)");
  }
  pVVar9 = p->vObjs;
  iVar8 = pVVar9->nSize;
  if (0 < (long)iVar8) {
    lVar7 = 0;
    do {
      if ((pVVar9->pArray[lVar7] != (void *)0x0) &&
         ((*(byte *)((long)pVVar9->pArray[lVar7] + 8) & 0x30) != 0)) {
        __assert_fail("!pObj->fMarkA && !pObj->fMarkB",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyDfs.c"
                      ,0x5f,"Vec_Int_t *Ivy_ManDfs(Ivy_Man_t *)");
      }
      lVar7 = lVar7 + 1;
    } while (iVar8 != lVar7);
  }
  iVar2 = p->nObjs[5];
  iVar3 = p->nObjs[6];
  vNodes = (Vec_Int_t *)malloc(0x10);
  iVar6 = 0x10;
  if (0xe < (iVar2 + iVar3) - 1U) {
    iVar6 = iVar2 + iVar3;
  }
  vNodes->nSize = 0;
  vNodes->nCap = iVar6;
  if (iVar6 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar6 << 2);
  }
  vNodes->pArray = piVar4;
  pVVar5 = p->vPos;
  if (0 < pVVar5->nSize) {
    lVar7 = 0;
    do {
      Ivy_ManDfs_rec(p,(Ivy_Obj_t *)
                       (*(ulong *)((long)pVVar5->pArray[lVar7] + 0x10) & 0xfffffffffffffffe),vNodes)
      ;
      lVar7 = lVar7 + 1;
      pVVar5 = p->vPos;
    } while (lVar7 < pVVar5->nSize);
    pVVar9 = p->vObjs;
    iVar8 = pVVar9->nSize;
  }
  if (0 < iVar8) {
    lVar7 = 0;
    do {
      if (pVVar9->pArray[lVar7] != (void *)0x0) {
        pbVar1 = (byte *)((long)pVVar9->pArray[lVar7] + 8);
        *pbVar1 = *pbVar1 & 0xef;
        pVVar9 = p->vObjs;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < pVVar9->nSize);
  }
  if (vNodes->nSize == p->nObjs[6] + p->nObjs[5] + p->nObjs[7]) {
    return vNodes;
  }
  __assert_fail("Vec_IntSize(vNodes) == Ivy_ManNodeNum(p) + Ivy_ManBufNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyDfs.c"
                ,0x6a,"Vec_Int_t *Ivy_ManDfs(Ivy_Man_t *)");
}

Assistant:

Vec_Int_t * Ivy_ManDfs( Ivy_Man_t * p )
{
    Vec_Int_t * vNodes;
    Ivy_Obj_t * pObj;
    int i;
    assert( Ivy_ManLatchNum(p) == 0 );
    // make sure the nodes are not marked
    Ivy_ManForEachObj( p, pObj, i )
        assert( !pObj->fMarkA && !pObj->fMarkB );
    // collect the nodes
    vNodes = Vec_IntAlloc( Ivy_ManNodeNum(p) );
    Ivy_ManForEachPo( p, pObj, i )
        Ivy_ManDfs_rec( p, Ivy_ObjFanin0(pObj), vNodes );
    // unmark the collected nodes
//    Ivy_ManForEachNodeVec( p, vNodes, pObj, i )
//        Ivy_ObjClearMarkA(pObj);
    Ivy_ManForEachObj( p, pObj, i )
        Ivy_ObjClearMarkA(pObj);
    // make sure network does not have dangling nodes
    assert( Vec_IntSize(vNodes) == Ivy_ManNodeNum(p) + Ivy_ManBufNum(p) );
    return vNodes;
}